

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deSocket.c
# Opt level: O0

deBool deSocket_connect(deSocket *sock,deSocketAddress *address)

{
  ushort uVar1;
  deBool dVar2;
  int iVar3;
  int __protocol;
  socklen_t local_54;
  sockaddr *psStack_50;
  NativeSocklen bsdAddrLen;
  sockaddr *bsdAddr;
  deUint8 bsdAddrBuf [28];
  deSocketAddress *address_local;
  deSocket *sock_local;
  
  psStack_50 = (sockaddr *)&bsdAddr;
  dVar2 = deSocketAddressToBsdAddress(address,0x1c,psStack_50,&local_54);
  if (dVar2 == 0) {
    sock_local._4_4_ = 0;
  }
  else {
    uVar1 = psStack_50->sa_family;
    iVar3 = deSocketTypeToBsdType(address->type);
    __protocol = deSocketProtocolToBsdProtocol(address->protocol);
    iVar3 = socket((uint)uVar1,iVar3,__protocol);
    sock->handle = iVar3;
    dVar2 = deSocketHandleIsValid(sock->handle);
    if (dVar2 == 0) {
      sock_local._4_4_ = 0;
    }
    else {
      iVar3 = connect(sock->handle,(sockaddr *)psStack_50,local_54);
      if (iVar3 == 0) {
        sock->state = DE_SOCKETSTATE_CONNECTED;
        sock->openChannels = 3;
        sock_local._4_4_ = 1;
      }
      else {
        close(sock->handle);
        sock->handle = -1;
        sock_local._4_4_ = 0;
      }
    }
  }
  return sock_local._4_4_;
}

Assistant:

deBool deSocket_connect (deSocket* sock, const deSocketAddress* address)
{
	deUint8				bsdAddrBuf[sizeof(struct sockaddr_in6)];
	struct sockaddr*	bsdAddr		= (struct sockaddr*)&bsdAddrBuf[0];
	NativeSocklen		bsdAddrLen;

	/* Resolve address. */
	if (!deSocketAddressToBsdAddress(address, sizeof(bsdAddrBuf), bsdAddr, &bsdAddrLen))
		return DE_FALSE;

	/* Create socket. */
	sock->handle = socket(bsdAddr->sa_family, deSocketTypeToBsdType(address->type), deSocketProtocolToBsdProtocol(address->protocol));
	if (!deSocketHandleIsValid(sock->handle))
		return DE_FALSE;

	/* Connect. */
	if (connect(sock->handle, bsdAddr, bsdAddrLen) != 0)
	{
#if defined(DE_USE_WINSOCK)
		closesocket(sock->handle);
#else
		close(sock->handle);
#endif
		sock->handle = DE_INVALID_SOCKET_HANDLE;
		return DE_FALSE;
	}

	sock->state			= DE_SOCKETSTATE_CONNECTED;
	sock->openChannels	= DE_SOCKETCHANNEL_BOTH;

	return DE_TRUE;
}